

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluObjectWrapper.cpp
# Opt level: O2

void __thiscall
glu::ObjectWrapper::ObjectWrapper(ObjectWrapper *this,Functions *gl,ObjectTraits *traits)

{
  char *pcVar1;
  GLenum error;
  ostream *poVar2;
  OutOfMemoryError *this_00;
  string local_1b8;
  ostringstream msg;
  
  this->m_gl = gl;
  this->m_traits = traits;
  this->m_object = 0;
  (**(code **)((long)&gl->activeShaderProgram + traits->genFunc))(1,&this->m_object);
  if (this->m_object != 0) {
    return;
  }
  error = (*gl->getError)();
  pcVar1 = traits->name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar2 = std::operator<<((ostream *)&msg,"Failed to create ");
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2," object, got ");
  local_1b8._M_dataplus._M_p = (pointer)getErrorName;
  local_1b8._M_string_length._0_4_ = error;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1b8,poVar2);
  this_00 = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
  if (error == 0x505) {
    std::__cxx11::stringbuf::str();
    OutOfMemoryError::OutOfMemoryError(this_00,&local_1b8);
    __cxa_throw(this_00,&OutOfMemoryError::typeinfo,OutOfMemoryError::~OutOfMemoryError);
  }
  std::__cxx11::stringbuf::str();
  Error::Error((Error *)this_00,error,&local_1b8);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

ObjectWrapper::ObjectWrapper (const glw::Functions& gl, const ObjectTraits& traits)
	: m_gl		(gl)
	, m_traits	(traits)
	, m_object	(0)
{
	(gl.*traits.genFunc)(1, &m_object);

	if (m_object == 0)
	{
		const deUint32		err			= gl.getError();
		const char*			objectName	= traits.name;
		std::ostringstream	msg;

		msg << "Failed to create " << objectName << " object, got " << getErrorStr((int)err);

		if (err == GL_OUT_OF_MEMORY)
			throw OutOfMemoryError(msg.str());
		else
			throw Error((int)err, msg.str());
	}
}